

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

bool __thiscall dg::vr::Bucket::EdgeIterator::nextViableTopEdge(EdgeIterator *this)

{
  SetIterator *pSVar1;
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  *this_00;
  Bucket *pBVar2;
  bool bVar3;
  pointer pDVar4;
  RelationEdge local_38;
  
  pDVar4 = (this->stack).
           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    bVar3 = DirectRelIterator::nextViableEdge(pDVar4 + -1);
    if (!bVar3) {
      return false;
    }
    bVar3 = isViable(this);
    if (bVar3) break;
    pSVar1 = &(this->stack).
              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].bucketIt;
    pSVar1->_M_current = pSVar1->_M_current + 1;
    pDVar4 = (this->stack).
             super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
  ::_M_emplace_unique<dg::vr::Bucket::RelationEdge_const&>
            ((_Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
              *)(this->visited)._M_data,
             &(this->stack).
              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].current);
  if (this->undirectedOnly != true) {
    return true;
  }
  this_00 = &((this->visited)._M_data)->_M_t;
  pDVar4 = (this->stack).
           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = pDVar4[-1].current._to._M_data;
  local_38._rel = dg::vr::Relations::inverted(pDVar4[-1].current._rel);
  local_38._to._M_data = pDVar4[-1].current._from._M_data;
  local_38._from._M_data = pBVar2;
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::_M_emplace_unique<dg::vr::Bucket::RelationEdge>(this_00,&local_38);
  return true;
}

Assistant:

bool nextViableTopEdge() {
            while (stack.back().nextViableEdge()) {
                if (isViable()) {
                    visited.get().emplace(*stack.back());
                    if (undirectedOnly)
                        visited.get().emplace(stack.back()->inverted());
                    return true;
                }
                stack.back().inc();
            }
            return false;
        }